

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

void Fra_ClausSimInfoRealloc(Clu_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  Vec_Ptr_t *p_01;
  int i;
  
  if (p->nCexes != p->nCexesAlloc) {
    __assert_fail("p->nCexes == p->nCexesAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                  ,0x3f3,"void Fra_ClausSimInfoRealloc(Clu_Man_t *)");
  }
  p_00 = p->vCexes;
  if (1 < p_00->nSize) {
    pvVar2 = Vec_PtrEntry(p_00,1);
    pvVar3 = Vec_PtrEntry(p_00,0);
    iVar1 = (int)((ulong)((long)pvVar2 - (long)pvVar3) >> 2);
    p_01 = Vec_PtrAllocSimInfo(p_00->nSize,iVar1 * 2);
    for (i = 0; i < p_00->nSize; i = i + 1) {
      pvVar2 = Vec_PtrEntry(p_01,i);
      pvVar3 = Vec_PtrEntry(p_00,i);
      memcpy(pvVar2,pvVar3,(long)(iVar1 << 2));
    }
    free(p_00->pArray);
    p_00->pArray = p_01->pArray;
    free(p_01);
    Vec_PtrCleanSimInfo(p->vCexes,p->nCexesAlloc / 0x20,p->nCexesAlloc / 0x10);
    p->nCexesAlloc = p->nCexesAlloc << 1;
    return;
  }
  __assert_fail("Vec_PtrSize(vInfo) > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x434,"void Vec_PtrReallocSimInfo(Vec_Ptr_t *)");
}

Assistant:

void Fra_ClausSimInfoRealloc( Clu_Man_t * p )
{
    assert( p->nCexes == p->nCexesAlloc );
    Vec_PtrReallocSimInfo( p->vCexes );
    Vec_PtrCleanSimInfo( p->vCexes, p->nCexesAlloc/32, 2 * p->nCexesAlloc/32 );
    p->nCexesAlloc *= 2;
}